

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

InnerProductLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(NeuralNetworkLayer *this)

{
  InnerProductLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x8c) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x8c;
    this_00 = (InnerProductLayerParams *)operator_new(0x38);
    InnerProductLayerParams::InnerProductLayerParams(this_00);
    (this->layer_).innerproduct_ = this_00;
  }
  return (InnerProductLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::InnerProductLayerParams* NeuralNetworkLayer::mutable_innerproduct() {
  if (!has_innerproduct()) {
    clear_layer();
    set_has_innerproduct();
    layer_.innerproduct_ = new ::CoreML::Specification::InnerProductLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.innerProduct)
  return layer_.innerproduct_;
}